

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDDMAP mtbdd_map_update(MTBDDMAP map1,MTBDDMAP map2)

{
  int iVar1;
  uint32_t var;
  uint32_t var_00;
  mtbddnode_t n;
  mtbddnode_t n_00;
  MTBDD MVar2;
  MTBDDMAP MVar3;
  MTBDD map2_00;
  MTBDDMAP low_2;
  MTBDDMAP low_1;
  MTBDDMAP low;
  MTBDDMAP result;
  uint32_t k2;
  uint32_t k1;
  mtbddnode_t n2;
  mtbddnode_t n1;
  MTBDDMAP map2_local;
  MTBDDMAP map1_local;
  
  iVar1 = mtbdd_map_isempty(map1);
  map1_local = map2;
  if ((iVar1 == 0) && (iVar1 = mtbdd_map_isempty(map2), map1_local = map1, iVar1 == 0)) {
    n = MTBDD_GETNODE(map1);
    n_00 = MTBDD_GETNODE(map2);
    var = mtbddnode_getvariable(n);
    var_00 = mtbddnode_getvariable(n_00);
    if (var < var_00) {
      MVar2 = mtbddnode_followlow(map1,n);
      MVar3 = mtbdd_map_update(MVar2,map2);
      MVar2 = mtbddnode_followhigh(map1,n);
      low = mtbdd_makemapnode(var,MVar3,MVar2);
    }
    else if (var_00 < var) {
      MVar2 = mtbddnode_followlow(map2,n_00);
      MVar3 = mtbdd_map_update(map1,MVar2);
      MVar2 = mtbddnode_followhigh(map2,n_00);
      low = mtbdd_makemapnode(var_00,MVar3,MVar2);
    }
    else {
      MVar2 = mtbddnode_followlow(map1,n);
      map2_00 = mtbddnode_followlow(map2,n_00);
      MVar3 = mtbdd_map_update(MVar2,map2_00);
      MVar2 = mtbddnode_followhigh(map2,n_00);
      low = mtbdd_makemapnode(var_00,MVar3,MVar2);
    }
    map1_local = low;
  }
  return map1_local;
}

Assistant:

MTBDDMAP
mtbdd_map_update(MTBDDMAP map1, MTBDDMAP map2)
{
    if (mtbdd_map_isempty(map1)) return map2;
    if (mtbdd_map_isempty(map2)) return map1;

    mtbddnode_t n1 = MTBDD_GETNODE(map1);
    mtbddnode_t n2 = MTBDD_GETNODE(map2);
    uint32_t k1 = mtbddnode_getvariable(n1);
    uint32_t k2 = mtbddnode_getvariable(n2);

    MTBDDMAP result;
    if (k1 < k2) {
        MTBDDMAP low = mtbdd_map_update(node_getlow(map1, n1), map2);
        result = mtbdd_makemapnode(k1, low, node_gethigh(map1, n1));
    } else if (k1 > k2) {
        MTBDDMAP low = mtbdd_map_update(map1, node_getlow(map2, n2));
        result = mtbdd_makemapnode(k2, low, node_gethigh(map2, n2));
    } else {
        MTBDDMAP low = mtbdd_map_update(node_getlow(map1, n1), node_getlow(map2, n2));
        result = mtbdd_makemapnode(k2, low, node_gethigh(map2, n2));
    }

    return result;
}